

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O0

ws_header_status __thiscall
cinatra::websocket::parse_header(websocket *this,char *buf,size_t size,bool is_server)

{
  byte bVar1;
  uint16_t uVar2;
  __uint64_t _Var3;
  byte in_CL;
  uint uVar4;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  int length_field;
  int pos;
  uchar msg_masked;
  uchar *inp;
  long local_58;
  long local_50;
  int local_38;
  ws_header_status local_4;
  
  *(byte *)(in_RDI + 0x24) = *in_RSI & 0xf;
  *(char *)(in_RDI + 0x25) = (char)((int)(uint)*in_RSI >> 7);
  bVar1 = in_RSI[1];
  local_38 = 2;
  uVar4 = in_RSI[1] & 0xffffff7f;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  if (uVar4 < 0x7e) {
    *(undefined4 *)(in_RDI + 0x34) = 6;
    *(long *)(in_RDI + 0x10) = (long)(int)uVar4;
  }
  else if (uVar4 == 0x7e) {
    *(undefined4 *)(in_RDI + 0x34) = 8;
    uVar2 = ntohs(*(uint16_t *)(in_RSI + 2));
    *(ulong *)(in_RDI + 0x10) = (ulong)uVar2;
    local_38 = 4;
    if ((in_CL & 1) == 0) {
      local_50 = 4 - in_RDX;
    }
    else {
      local_50 = 8 - in_RDX;
    }
    *(long *)(in_RDI + 0x18) = local_50;
  }
  else {
    if (uVar4 != 0x7f) {
      *(undefined4 *)(in_RDI + 0x34) = 0xf;
      return error;
    }
    *(undefined4 *)(in_RDI + 0x34) = 0xe;
    _Var3 = __bswap_64(*(__uint64_t *)(in_RSI + 2));
    *(__uint64_t *)(in_RDI + 0x10) = _Var3;
    local_38 = 10;
    if ((in_CL & 1) == 0) {
      local_58 = 10 - in_RDX;
    }
    else {
      local_58 = 0xe - in_RDX;
    }
    *(long *)(in_RDI + 0x18) = local_58;
  }
  if ((char)((int)(uint)bVar1 >> 7) != '\0') {
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + local_38);
  }
  local_4 = incomplete;
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_4 = complete;
  }
  return local_4;
}

Assistant:

ws_header_status parse_header(const char *buf, size_t size,
                                bool is_server = true) {
    const unsigned char *inp = (const unsigned char *)(buf);

    msg_opcode_ = inp[0] & 0x0F;
    msg_fin_ = (inp[0] >> 7) & 0x01;
    unsigned char msg_masked = (inp[1] >> 7) & 0x01;

    int pos = 2;
    int length_field = inp[1] & (~0x80);

    left_header_len_ = 0;
    if (length_field <= 125) {
      len_bytes_ = SHORT_HEADER;
      payload_length_ = length_field;
    }
    else if (length_field == 126)  // msglen is 16bit!
    {
      len_bytes_ = MEDIUM_HEADER;
      payload_length_ = ntohs(*(uint16_t *)&inp[2]);  // (inp[2] << 8) + inp[3];
      pos += 2;
      left_header_len_ =
          is_server ? MEDIUM_HEADER - size : CLIENT_MEDIUM_HEADER - size;
    }
    else if (length_field == 127)  // msglen is 64bit!
    {
      len_bytes_ = LONG_HEADER;
      payload_length_ = (size_t)be64toh(*(uint64_t *)&inp[2]);
      pos += 8;
      left_header_len_ =
          is_server ? LONG_HEADER - size : CLIENT_LONG_HEADER - size;
    }
    else {
      len_bytes_ = INVALID_HEADER;
      return ws_header_status::error;
    }

    if (msg_masked) {
      std::memcpy(mask_key_, inp + pos, 4);
    }

    return left_header_len_ == 0 ? ws_header_status::complete
                                 : ws_header_status::incomplete;
  }